

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddTxSignByHandle
              (void *handle,void *create_handle,char *txid,uint32_t vout,int hash_type,
              char *sign_data_hex,bool use_der_encode,int sighash_type,bool sighash_anyone_can_pay,
              bool clear_stack)

{
  bool bVar1;
  AddressType AVar2;
  CfdException *pCVar3;
  uint uVar4;
  initializer_list<cfd::SignParameter> __l;
  bool is_bitcoin;
  allocator local_191;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  SigHashType sighashtype;
  SignParameter param;
  SignParameter local_e8;
  SigHashType local_70;
  SigHashType local_64;
  OutPoint outpoint;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&param,"TransactionData",(allocator *)&local_e8);
  cfd::capi::CheckBuffer(create_handle,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x4bd;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddTxSignByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. txid is null or empty.",(allocator *)&local_e8
              );
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  if (*(long *)((long)create_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&local_e8,txid,(allocator *)&sign_list);
    cfd::core::Txid::Txid((Txid *)&param,(string *)&local_e8);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&param,vout);
    cfd::core::Txid::~Txid((Txid *)&param);
    std::__cxx11::string::~string((string *)&local_e8);
    AVar2 = cfd::capi::ConvertHashToAddressType(hash_type);
    if (sign_data_hex != (char *)0x0) {
      bVar1 = cfd::capi::IsEmptyString(sign_data_hex);
      uVar4 = AVar2 - kP2wshAddress;
      if (uVar4 < 0xfffffffe && !use_der_encode || !bVar1) {
        cfd::SignParameter::SignParameter(&param);
        if (use_der_encode) {
          cfd::core::SigHashType::Create
                    (&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
          std::__cxx11::string::string((string *)&local_e8,sign_data_hex,&local_191);
          cfd::core::ByteData::ByteData((ByteData *)&sign_list,(string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          cfd::core::SigHashType::SigHashType(&local_64,&sighashtype);
          cfd::SignParameter::SignParameter(&local_e8,(ByteData *)&sign_list,true,&local_64);
          cfd::SignParameter::operator=(&param,&local_e8);
          cfd::SignParameter::~SignParameter(&local_e8);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign_list);
        }
        else {
          std::__cxx11::string::string((string *)&sign_list,sign_data_hex,(allocator *)&sighashtype)
          ;
          cfd::core::SigHashType::SigHashType(&local_70,kSigHashAll,false,false);
          cfd::SignParameter::SignParameter(&local_e8,(string *)&sign_list,false,&local_70);
          cfd::SignParameter::operator=(&param,&local_e8);
          cfd::SignParameter::~SignParameter(&local_e8);
          std::__cxx11::string::~string((string *)&sign_list);
        }
        cfd::SignParameter::SignParameter(&local_e8,&param);
        __l._M_len = 1;
        __l._M_array = &local_e8;
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
                  (&sign_list,__l,(allocator_type *)&sighashtype);
        cfd::SignParameter::~SignParameter(&local_e8);
        if (is_bitcoin == true) {
          cfd::TransactionContext::AddSign
                    ((TransactionContext *)
                     *(ConfidentialTransactionContext **)((long)create_handle + 0x18),&outpoint,
                     &sign_list,uVar4 < 0xfffffffe,clear_stack);
        }
        else {
          cfd::ConfidentialTransactionContext::AddSign
                    (*(ConfidentialTransactionContext **)((long)create_handle + 0x18),&outpoint,
                     &sign_list,uVar4 < 0xfffffffe,clear_stack);
        }
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&sign_list);
        cfd::SignParameter::~SignParameter(&param);
        cfd::core::Txid::~Txid(&outpoint.txid_);
        return 0;
      }
    }
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x4d4;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddTxSignByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"sign data is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. sign data is null or empty.",
               (allocator *)&local_e8);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&param,"Invalid handle state. tx is null",(allocator *)&local_e8);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&param);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxSignByHandle(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int hash_type, const char* sign_data_hex, bool use_der_encode,
    int sighash_type, bool sighash_anyone_can_pay, bool clear_stack) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    }
    OutPoint outpoint(Txid(txid), vout);

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    if ((sign_data_hex == nullptr) ||
        (IsEmptyString(sign_data_hex) && (use_der_encode || !is_witness))) {
      warn(CFD_LOG_SOURCE, "sign data is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sign data is null or empty.");
    }

    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(sign_data_hex));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(sign_data_hex));
    }
    std::vector<SignParameter> sign_list = {param};

    if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddSign(outpoint, sign_list, is_witness, clear_stack);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddSign(outpoint, sign_list, is_witness, clear_stack);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}